

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryfusefilter.h
# Opt level: O1

_Bool binary_fuse8_populate(uint64_t *keys,uint32_t size,binary_fuse8_t *filter)

{
  ulong *puVar1;
  uint64_t uVar2;
  ulong uVar3;
  ulong uVar4;
  uint8_t *puVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  byte bVar10;
  int iVar11;
  void *__s;
  void *__s_00;
  void *__s_01;
  void *__ptr;
  ulong uVar12;
  _Bool _Var13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  byte bVar19;
  uint uVar20;
  ulong uVar21;
  binary_fuse8_t *pbVar22;
  byte bVar23;
  uint32_t i;
  int iVar24;
  long lVar25;
  ulong uVar26;
  uint uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  uint32_t h012 [5];
  ulong local_f8;
  ulong local_f0;
  uint local_d8 [4];
  uint local_c8;
  void *local_c0;
  ulong local_b8;
  ulong local_b0;
  void *local_a8;
  ulong local_a0;
  int local_94;
  binary_fuse8_t *local_90;
  uint64_t *local_88;
  ulong local_80;
  size_t local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  long local_58;
  ulong local_50;
  undefined1 local_48 [16];
  
  if (filter->Size != size) {
    return false;
  }
  local_f8 = (ulong)size;
  filter->Seed = 0x6df6b22537d23467;
  local_88 = keys;
  __s = calloc((ulong)(size + 1),8);
  uVar17 = (ulong)filter->ArrayLength;
  local_a8 = malloc(uVar17 * 4);
  __s_00 = calloc(uVar17,1);
  local_c0 = malloc(local_f8);
  local_a0 = uVar17;
  __s_01 = calloc(uVar17,8);
  iVar11 = -0x40;
  do {
    iVar16 = iVar11;
    uVar27 = 1 << ((char)iVar16 + 0x41U & 0x1f);
    iVar11 = iVar16 + 1;
  } while (uVar27 < filter->SegmentCount);
  uVar17 = (ulong)uVar27;
  local_90 = filter;
  __ptr = malloc(uVar17 * 4);
  auVar29._0_4_ = -(uint)((int)((ulong)local_a8 >> 0x20) == 0 && (int)local_a8 == 0);
  auVar29._4_4_ = -(uint)((int)__s_00 == 0 && (int)((ulong)__s_00 >> 0x20) == 0);
  auVar29._8_4_ = -(uint)((int)((ulong)local_c0 >> 0x20) == 0 && (int)local_c0 == 0);
  auVar29._12_4_ = -(uint)((int)__s_01 == 0 && (int)((ulong)__s_01 >> 0x20) == 0);
  iVar11 = movmskps((int)__ptr,auVar29);
  _Var13 = false;
  if (((iVar11 == 0) && (_Var13 = false, __s != (void *)0x0)) &&
     (_Var13 = false, __ptr != (void *)0x0)) {
    local_94 = iVar16 + 0x41;
    *(undefined8 *)((long)__s + local_f8 * 8) = 1;
    local_68 = (ulong)(uint)-(iVar16 + 1);
    local_70 = uVar17 + 1 & 0xfffffffffffffffe;
    lVar25 = uVar17 - 1;
    auVar31._8_4_ = (int)lVar25;
    auVar31._0_8_ = lVar25;
    auVar31._12_4_ = (int)((ulong)lVar25 >> 0x20);
    local_78 = local_a0 * 8;
    local_80 = 0x10a2a556c2d61962;
    auVar31 = auVar31 ^ _DAT_00109070;
    iVar11 = 1;
    local_48 = auVar31;
    pbVar22 = local_90;
    auVar29 = _DAT_00109070;
    do {
      iVar16 = (int)local_f8;
      uVar15 = 0;
      uVar17 = 0;
      auVar28 = _DAT_00109060;
      do {
        auVar30 = auVar28 ^ auVar29;
        if ((bool)(~(auVar30._4_4_ == auVar31._4_4_ && auVar31._0_4_ < auVar30._0_4_ ||
                    auVar31._4_4_ < auVar30._4_4_) & 1)) {
          *(uint *)((long)__ptr + uVar17 * 4) = uVar15 >> ((byte)local_94 & 0x1f);
        }
        if ((auVar30._12_4_ != auVar31._12_4_ || auVar30._8_4_ <= auVar31._8_4_) &&
            auVar30._12_4_ <= auVar31._12_4_) {
          *(uint *)((long)__ptr + uVar17 * 4 + 4) = iVar16 + uVar15 >> ((byte)local_94 & 0x1f);
        }
        uVar17 = uVar17 + 2;
        lVar25 = auVar28._8_8_;
        auVar28._0_8_ = auVar28._0_8_ + 2;
        auVar28._8_8_ = lVar25 + 2;
        uVar15 = uVar15 + iVar16 * 2;
      } while (local_70 != uVar17);
      if (iVar16 == 0) {
        bVar9 = true;
        local_b8 = 0;
      }
      else {
        uVar2 = pbVar22->Seed;
        uVar17 = 0;
        do {
          uVar14 = local_88[uVar17] + uVar2;
          uVar14 = (uVar14 >> 0x21 ^ uVar14) * -0xae502812aa7333;
          uVar14 = (uVar14 >> 0x21 ^ uVar14) * -0x3b314601e57a13ad;
          uVar14 = uVar14 >> 0x21 ^ uVar14;
          uVar21 = uVar14 >> ((byte)local_68 & 0x3f);
          while( true ) {
            uVar15 = *(uint *)((long)__ptr + uVar21 * 4);
            if (*(long *)((long)__s + (ulong)uVar15 * 8) == 0) break;
            uVar21 = (ulong)((int)uVar21 + 1U & uVar27 - 1);
          }
          *(ulong *)((long)__s + (ulong)uVar15 * 8) = uVar14;
          *(uint *)((long)__ptr + uVar21 * 4) = uVar15 + 1;
          uVar17 = uVar17 + 1;
        } while (uVar17 != (local_f8 & 0xffffffff));
        uVar15 = pbVar22->SegmentLength;
        uVar20 = pbVar22->SegmentLengthMask;
        local_50 = (ulong)uVar20;
        local_b0 = (ulong)uVar15;
        local_58 = (ulong)uVar15 * 2;
        uVar17 = 0;
        local_60 = CONCAT44(0,pbVar22->SegmentCountLength);
        bVar9 = false;
        local_b8 = 0;
        do {
          uVar14 = *(ulong *)((long)__s + uVar17 * 8);
          auVar30._8_8_ = 0;
          auVar30._0_8_ = local_60;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = uVar14;
          lVar25 = SUB168(auVar30 * auVar6,8);
          *(char *)((long)__s_00 + lVar25) = *(char *)((long)__s_00 + lVar25) + '\x04';
          puVar1 = (ulong *)((long)__s_01 + lVar25 * 8);
          *puVar1 = *puVar1 ^ uVar14;
          iVar24 = SUB164(auVar30 * auVar6,8);
          uVar12 = (ulong)((uint)(uVar14 >> 0x12) & uVar20 & 0x3ffff ^ iVar24 + uVar15);
          bVar19 = *(byte *)((long)__s_00 + uVar12);
          puVar1 = (ulong *)((long)__s_01 + uVar12 * 8);
          *puVar1 = *puVar1 ^ uVar14;
          *(byte *)((long)__s_00 + uVar12) = (bVar19 ^ 1) + 4;
          uVar26 = (ulong)((uint)uVar14 & uVar20 ^ (int)local_58 + iVar24);
          bVar19 = *(char *)((long)__s_00 + uVar26) + 4;
          *(byte *)((long)__s_00 + uVar26) = bVar19;
          uVar21 = *(ulong *)((long)__s_01 + uVar26 * 8);
          uVar18 = uVar21 ^ uVar14;
          *(ulong *)((long)__s_01 + uVar26 * 8) = uVar18;
          *(byte *)((long)__s_00 + uVar26) = bVar19 ^ 2;
          uVar3 = *(ulong *)((long)__s_01 + lVar25 * 8);
          uVar4 = *(ulong *)((long)__s_01 + uVar12 * 8);
          if (((uVar18 & uVar3 & uVar4) == 0) &&
             ((((uVar3 == 0 && (*(char *)((long)__s_00 + lVar25) == '\b')) ||
               ((uVar4 == 0 && (*(char *)((long)__s_00 + uVar12) == '\b')))) ||
              ((uVar21 == uVar14 && (bVar19 == 10)))))) {
            local_b8 = (ulong)((int)local_b8 + 1);
            *(char *)((long)__s_00 + lVar25) = *(char *)((long)__s_00 + lVar25) + -4;
            *(ulong *)((long)__s_01 + lVar25 * 8) = uVar3 ^ uVar14;
            bVar19 = *(byte *)((long)__s_00 + uVar12);
            puVar1 = (ulong *)((long)__s_01 + uVar12 * 8);
            *puVar1 = *puVar1 ^ uVar14;
            *(byte *)((long)__s_00 + uVar12) = (bVar19 ^ 1) - 4;
            *(byte *)((long)__s_00 + uVar26) = (*(byte *)((long)__s_00 + uVar26) ^ 2) - 4;
            puVar1 = (ulong *)((long)__s_01 + uVar26 * 8);
            *puVar1 = *puVar1 ^ uVar14;
          }
          if (*(byte *)((long)__s_00 + lVar25) < 4) {
            bVar9 = true;
          }
          if (*(byte *)((long)__s_00 + uVar12) < 4) {
            bVar9 = true;
          }
          if (*(byte *)((long)__s_00 + uVar26) < 4) {
            bVar9 = true;
          }
          uVar17 = uVar17 + 1;
        } while ((local_f8 & 0xffffffff) != uVar17);
        bVar9 = !bVar9;
        pbVar22 = local_90;
      }
      iVar24 = 6;
      if (bVar9) {
        local_f0 = 0;
        uVar17 = 0;
        if (local_a0 != 0) {
          uVar14 = 0;
          uVar15 = 0;
          do {
            *(int *)((long)local_a8 + (ulong)uVar15 * 4) = (int)uVar14;
            uVar15 = ((*(byte *)((long)__s_00 + uVar14) & 0xfc) == 4) + uVar15;
            uVar17 = (ulong)uVar15;
            uVar14 = uVar14 + 1;
          } while (local_a0 != uVar14);
        }
        if ((int)uVar17 != 0) {
          local_f0 = 0;
          do {
            uVar15 = (int)uVar17 - 1;
            uVar17 = (ulong)uVar15;
            uVar14 = (ulong)*(uint *)((long)local_a8 + uVar17 * 4);
            bVar19 = *(byte *)((long)__s_00 + uVar14);
            if ((bVar19 & 0xfc) == 4) {
              uVar14 = *(ulong *)((long)__s_01 + uVar14 * 8);
              auVar7._8_8_ = 0;
              auVar7._0_8_ = uVar14;
              local_d8[3] = SUB164(ZEXT416(pbVar22->SegmentCountLength) * auVar7,8);
              local_d8[1] = (uint)(uVar14 >> 0x12) & pbVar22->SegmentLengthMask & 0x3ffff ^
                            local_d8[3] + pbVar22->SegmentLength;
              local_d8[2] = pbVar22->SegmentLengthMask & (uint)uVar14 ^
                            local_d8[3] + pbVar22->SegmentLength * 2;
              local_c8 = local_d8[1];
              uVar20 = bVar19 & 3;
              uVar21 = (ulong)local_d8[(ulong)uVar20 + 1];
              bVar19 = *(byte *)((long)__s_00 + uVar21);
              bVar10 = (byte)uVar20;
              *(uint *)((long)local_a8 + uVar17 * 4) = local_d8[(ulong)uVar20 + 1];
              uVar15 = uVar15 + ((bVar19 & 0xfc) == 8);
              bVar23 = bVar10 - 2;
              if (bVar10 < 2) {
                bVar23 = bVar10 + 1;
              }
              *(byte *)((long)local_c0 + local_f0) = bVar10;
              *(ulong *)((long)__s + local_f0 * 8) = uVar14;
              puVar1 = (ulong *)((long)__s_01 + uVar21 * 8);
              *puVar1 = *puVar1 ^ uVar14;
              *(byte *)((long)__s_00 + uVar21) = bVar23 ^ bVar19 - 4;
              uVar17 = (ulong)local_d8[uVar20 + 2];
              bVar19 = *(byte *)((long)__s_00 + uVar17);
              *(uint *)((long)local_a8 + (ulong)uVar15 * 4) = local_d8[uVar20 + 2];
              bVar10 = (char)(uVar20 + 2) - 3;
              if ((ulong)uVar20 == 0) {
                bVar10 = 2;
              }
              *(byte *)((long)__s_00 + uVar17) = bVar10 ^ bVar19 - 4;
              puVar1 = (ulong *)((long)__s_01 + uVar17 * 8);
              *puVar1 = *puVar1 ^ uVar14;
              uVar17 = (ulong)(((bVar19 & 0xfc) == 8) + uVar15);
              local_f0 = (ulong)((int)local_f0 + 1);
            }
          } while ((int)uVar17 != 0);
        }
        if ((int)local_f0 + (int)local_b8 != iVar16) {
          iVar24 = 0;
          if ((int)local_b8 != 0) {
            local_f8 = binary_fuse_sort_and_remove_dup(local_88,local_f8 & 0xffffffff);
          }
          goto LAB_0010305c;
        }
        iVar24 = 4;
        local_b0 = CONCAT44(local_b0._4_4_,(int)CONCAT71((int7)(local_f8 >> 8),1));
        local_f8 = local_f0;
      }
      else {
LAB_0010305c:
        local_b0 = local_b0 & 0xffffffff00000000;
        memset(__s,0,(local_f8 & 0xffffffff) << 3);
        memset(__s_00,0,local_a0);
        memset(__s_01,0,local_78);
        local_80 = local_80 + 0x9e3779b97f4a7c15;
        uVar17 = (local_80 >> 0x1e ^ local_80) * -0x40a7b892e31b1a47;
        uVar17 = (uVar17 >> 0x1b ^ uVar17) * -0x6b2fb644ecceee15;
        pbVar22->Seed = uVar17 >> 0x1f ^ uVar17;
        auVar31 = local_48;
        auVar29 = _DAT_00109070;
      }
      if ((iVar24 != 6) && (iVar24 != 0)) {
        if ((char)local_b0 == '\0') {
          return false;
        }
        _Var13 = true;
        uVar27 = (uint)local_f8;
        if (uVar27 != 0) {
          uVar15 = uVar27 - 1;
          do {
            uVar17 = *(ulong *)((long)__s + (ulong)uVar15 * 8);
            uVar14 = (ulong)*(byte *)((long)local_c0 + (ulong)uVar15);
            auVar8._8_8_ = 0;
            auVar8._0_8_ = uVar17;
            local_d8[0] = SUB164(ZEXT416(pbVar22->SegmentCountLength) * auVar8,8);
            local_d8[1] = (uint)(uVar17 >> 0x12) & pbVar22->SegmentLengthMask & 0x3ffff ^
                          local_d8[0] + pbVar22->SegmentLength;
            local_d8[2] = pbVar22->SegmentLengthMask & (uint)uVar17 ^
                          local_d8[0] + pbVar22->SegmentLength * 2;
            local_d8[3] = local_d8[0];
            local_c8 = local_d8[1];
            puVar5 = pbVar22->Fingerprints;
            puVar5[local_d8[uVar14]] =
                 (byte)(uVar17 >> 0x20) ^ (byte)uVar17 ^ puVar5[local_d8[uVar14 + 1]] ^
                 puVar5[local_d8[uVar14 + 2]];
            uVar15 = uVar15 - 1;
          } while (uVar15 < uVar27);
          _Var13 = true;
        }
        goto LAB_00103156;
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 != 0x65);
    memset(pbVar22->Fingerprints,0xff,(ulong)pbVar22->ArrayLength);
    _Var13 = false;
  }
LAB_00103156:
  free(local_a8);
  free(__s_00);
  free(local_c0);
  free(__s_01);
  free(__s);
  free(__ptr);
  return _Var13;
}

Assistant:

static inline bool binary_fuse8_populate(uint64_t *keys, uint32_t size,
                           binary_fuse8_t *filter) {
  if (size != filter->Size) {
    return false;
  }

  uint64_t rng_counter = 0x726b2b9d438b9d4d;
  filter->Seed = binary_fuse_rng_splitmix64(&rng_counter);
  uint64_t *reverseOrder = (uint64_t *)calloc((size + 1), sizeof(uint64_t));
  uint32_t capacity = filter->ArrayLength;
  uint32_t *alone = (uint32_t *)malloc(capacity * sizeof(uint32_t));
  uint8_t *t2count = (uint8_t *)calloc(capacity, sizeof(uint8_t));
  uint8_t *reverseH = (uint8_t *)malloc(size * sizeof(uint8_t));
  uint64_t *t2hash = (uint64_t *)calloc(capacity, sizeof(uint64_t));

  uint32_t blockBits = 1;
  while (((uint32_t)1 << blockBits) < filter->SegmentCount) {
    blockBits += 1;
  }
  uint32_t block = ((uint32_t)1 << blockBits);
  uint32_t *startPos = (uint32_t *)malloc((1U << blockBits) * sizeof(uint32_t));
  uint32_t h012[5];

  if ((alone == NULL) || (t2count == NULL) || (reverseH == NULL) ||
      (t2hash == NULL) || (reverseOrder == NULL) || (startPos == NULL)) {
    free(alone);
    free(t2count);
    free(reverseH);
    free(t2hash);
    free(reverseOrder);
    free(startPos);
    return false;
  }
  reverseOrder[size] = 1;
  for (int loop = 0; true; ++loop) {
    if (loop + 1 > XOR_MAX_ITERATIONS) {
      // The probability of this happening is lower than the
      // the cosmic-ray probability (i.e., a cosmic ray corrupts your system)
      memset(filter->Fingerprints, 0xFF, filter->ArrayLength);
      free(alone);
      free(t2count);
      free(reverseH);
      free(t2hash);
      free(reverseOrder);
      free(startPos);
      return false;
    }

    for (uint32_t i = 0; i < block; i++) {
      // important : i * size would overflow as a 32-bit number in some
      // cases.
      startPos[i] = (uint32_t)((uint64_t)i * size) >> blockBits;
    }

    uint64_t maskblock = block - 1;
    for (uint32_t i = 0; i < size; i++) {
      uint64_t hash = binary_fuse_murmur64(keys[i] + filter->Seed);
      uint64_t segment_index = hash >> (64 - blockBits);
      while (reverseOrder[startPos[segment_index]] != 0) {
        segment_index++;
        segment_index &= maskblock;
      }
      reverseOrder[startPos[segment_index]] = hash;
      startPos[segment_index]++;
    }
    int error = 0;
    uint32_t duplicates = 0;
    for (uint32_t i = 0; i < size; i++) {
      uint64_t hash = reverseOrder[i];
      uint32_t h0 = binary_fuse8_hash(0, hash, filter);
      t2count[h0] += 4;
      t2hash[h0] ^= hash;
      uint32_t h1= binary_fuse8_hash(1, hash, filter);
      t2count[h1] += 4;
      t2count[h1] ^= 1U;
      t2hash[h1] ^= hash;
      uint32_t h2 = binary_fuse8_hash(2, hash, filter);
      t2count[h2] += 4;
      t2hash[h2] ^= hash;
      t2count[h2] ^= 2U;
      if ((t2hash[h0] & t2hash[h1] & t2hash[h2]) == 0) {
        if   (((t2hash[h0] == 0) && (t2count[h0] == 8))
          ||  ((t2hash[h1] == 0) && (t2count[h1] == 8))
          ||  ((t2hash[h2] == 0) && (t2count[h2] == 8))) {
					duplicates += 1;
 					t2count[h0] -= 4;
 					t2hash[h0] ^= hash;
 					t2count[h1] -= 4;
 					t2count[h1] ^= 1U;
 					t2hash[h1] ^= hash;
 					t2count[h2] -= 4;
 					t2count[h2] ^= 2U;
 					t2hash[h2] ^= hash;
        }
      }
      error = (t2count[h0] < 4) ? 1 : error;
      error = (t2count[h1] < 4) ? 1 : error;
      error = (t2count[h2] < 4) ? 1 : error;
    }
    if(error) {
      memset(reverseOrder, 0, sizeof(uint64_t) * size);
      memset(t2count, 0, sizeof(uint8_t) * capacity);
      memset(t2hash, 0, sizeof(uint64_t) * capacity);
      filter->Seed = binary_fuse_rng_splitmix64(&rng_counter);
      continue;
    }

    // End of key addition
    uint32_t Qsize = 0;
    // Add sets with one key to the queue.
    for (uint32_t i = 0; i < capacity; i++) {
      alone[Qsize] = i;
      Qsize += ((t2count[i] >> 2U) == 1) ? 1U : 0U;
    }
    uint32_t stacksize = 0;
    while (Qsize > 0) {
      Qsize--;
      uint32_t index = alone[Qsize];
      if ((t2count[index] >> 2U) == 1) {
        uint64_t hash = t2hash[index];

        //h012[0] = binary_fuse8_hash(0, hash, filter);
        h012[1] = binary_fuse8_hash(1, hash, filter);
        h012[2] = binary_fuse8_hash(2, hash, filter);
        h012[3] = binary_fuse8_hash(0, hash, filter); // == h012[0];
        h012[4] = h012[1];
        uint8_t found = t2count[index] & 3U;
        reverseH[stacksize] = found;
        reverseOrder[stacksize] = hash;
        stacksize++;
        uint32_t other_index1 = h012[found + 1];
        alone[Qsize] = other_index1;
        Qsize += ((t2count[other_index1] >> 2U) == 2 ? 1U : 0U);

        t2count[other_index1] -= 4;
        t2count[other_index1] ^= binary_fuse_mod3(found + 1);
        t2hash[other_index1] ^= hash;

        uint32_t other_index2 = h012[found + 2];
        alone[Qsize] = other_index2;
        Qsize += ((t2count[other_index2] >> 2U) == 2 ? 1U : 0U);
        t2count[other_index2] -= 4;
        t2count[other_index2] ^= binary_fuse_mod3(found + 2);
        t2hash[other_index2] ^= hash;
      }
    }
    if (stacksize + duplicates == size) {
      // success
      size = stacksize;
      break;
    }
    if(duplicates > 0) {
      size = (uint32_t)binary_fuse_sort_and_remove_dup(keys, size);
    }
    memset(reverseOrder, 0, sizeof(uint64_t) * size);
    memset(t2count, 0, sizeof(uint8_t) * capacity);
    memset(t2hash, 0, sizeof(uint64_t) * capacity);
    filter->Seed = binary_fuse_rng_splitmix64(&rng_counter);
  }

  for (uint32_t i = size - 1; i < size; i--) {
    // the hash of the key we insert next
    uint64_t hash = reverseOrder[i];
    uint8_t xor2 = binary_fuse8_fingerprint(hash);
    uint8_t found = reverseH[i];
    h012[0] = binary_fuse8_hash(0, hash, filter);
    h012[1] = binary_fuse8_hash(1, hash, filter);
    h012[2] = binary_fuse8_hash(2, hash, filter);
    h012[3] = h012[0];
    h012[4] = h012[1];
    filter->Fingerprints[h012[found]] = (uint8_t)((uint32_t)xor2 ^
                                                  filter->Fingerprints[h012[found + 1]] ^
                                                  filter->Fingerprints[h012[found + 2]]);
  }
  free(alone);
  free(t2count);
  free(reverseH);
  free(t2hash);
  free(reverseOrder);
  free(startPos);
  return true;
}